

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

stumpless_sqlite3_prepare_func_t stumpless_get_sqlite3_prepare(stumpless_target *target,void **data)

{
  stumpless_id_t pvVar1;
  sqlite3_target *db_target;
  void **data_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    pvVar1 = target->id;
    if (data != (void **)0x0) {
      *data = *(void **)((long)pvVar1 + 0x18);
    }
    clear_error();
    target_local = *(stumpless_target **)((long)pvVar1 + 0x10);
  }
  return (stumpless_sqlite3_prepare_func_t)target_local;
}

Assistant:

stumpless_sqlite3_prepare_func_t
stumpless_get_sqlite3_prepare( const struct stumpless_target *target,
                               void **data ) {
  struct sqlite3_target *db_target;

  VALIDATE_ARG_NOT_NULL( target );

  db_target = target->id;

  if( data ) {
    *data = db_target->prepare_data;
  }

  clear_error();
  return db_target->prepare_func;
}